

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::LinearSystem::LinearSystem
          (LinearSystem *this,size_t stateSize,size_t controlSize,SparsityStructure *stateSparsity,
          SparsityStructure *controlSparsity)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 *puVar3;
  element_type *peVar4;
  MatrixDynSize *pMVar5;
  uint in_ESI;
  undefined8 *in_RDI;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempControl;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempState;
  SparsityStructure *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  LinearSystemPimpl *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  DynamicalSystem *in_stack_ffffffffffffff80;
  
  DynamicalSystem::DynamicalSystem
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
  *in_RDI = &PTR__LinearSystem_003fa6d0;
  puVar3 = (undefined8 *)operator_new(0xf8);
  puVar3[0x1c] = 0;
  puVar3[0x1d] = 0;
  puVar3[0x1a] = 0;
  puVar3[0x1b] = 0;
  puVar3[0x18] = 0;
  puVar3[0x19] = 0;
  puVar3[0x16] = 0;
  puVar3[0x17] = 0;
  puVar3[0x14] = 0;
  puVar3[0x15] = 0;
  puVar3[0x12] = 0;
  puVar3[0x13] = 0;
  puVar3[0x10] = 0;
  puVar3[0x11] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[0x1e] = 0;
  LinearSystemPimpl::LinearSystemPimpl(in_stack_ffffffffffffff70);
  in_RDI[0xb] = puVar3;
  std::make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>();
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e98d0);
  pMVar5 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(peVar4);
  iDynTree::MatrixDynSize::resize((ulong)pMVar5,(ulong)in_ESI);
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e9901);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(peVar4);
  iDynTree::MatrixDynSize::zero();
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>>::operator=
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *)
             in_stack_ffffffffffffff48);
  std::make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>();
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e9945);
  pMVar5 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(peVar4);
  iDynTree::MatrixDynSize::resize((ulong)pMVar5,(ulong)in_ESI);
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e997c);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(peVar4);
  iDynTree::MatrixDynSize::zero();
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>>::operator=
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *)
             in_stack_ffffffffffffff48);
  *(undefined1 *)(in_RDI[0xb] + 0xf0) = 0;
  *(undefined1 *)(in_RDI[0xb] + 0xf1) = 0;
  uVar1 = SparsityStructure::isValid
                    ((SparsityStructure *)
                     CONCAT17(in_stack_ffffffffffffff57,
                              CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
  if ((bool)uVar1) {
    *(undefined1 *)(in_RDI[0xb] + 0xf0) = 1;
    SparsityStructure::operator=
              ((SparsityStructure *)
               CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
               in_stack_ffffffffffffff48);
  }
  bVar2 = SparsityStructure::isValid
                    ((SparsityStructure *)
                     CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
  if (bVar2) {
    *(undefined1 *)(in_RDI[0xb] + 0xf1) = 1;
    SparsityStructure::operator=
              ((SparsityStructure *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff50)),
               in_stack_ffffffffffffff48);
  }
  std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>::
  ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *
              )0x2e9adf);
  std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>::
  ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *
              )0x2e9ae9);
  return;
}

Assistant:

LinearSystem::LinearSystem(size_t stateSize, size_t controlSize, const SparsityStructure &stateSparsity, const SparsityStructure &controlSparsity)
            : DynamicalSystem(stateSize, controlSize)
            , m_pimpl(new LinearSystemPimpl())
        {
            assert(m_pimpl);
            std::shared_ptr<TimeInvariantMatrix> tempState = std::make_shared<TimeInvariantMatrix>();
            tempState->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(stateSize));
            tempState->get().zero();
            m_pimpl->stateMatrix = tempState;

            std::shared_ptr<TimeInvariantMatrix> tempControl = std::make_shared<TimeInvariantMatrix>();
            tempControl->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(controlSize));
            tempControl->get().zero();
            m_pimpl->controlMatrix = tempControl;

            m_pimpl->hasStateSparsity = false;
            m_pimpl->hasControlSparsity = false;
            if (stateSparsity.isValid()) {
                m_pimpl->hasStateSparsity = true;
                m_pimpl->stateSparsity = stateSparsity;
            }
            if (controlSparsity.isValid()) {
                m_pimpl->hasControlSparsity = true;
                m_pimpl->controlSparsity = controlSparsity;
            }
        }